

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O3

void __thiscall Trace::TraceToLog(Trace *this,char *inFormat,__va_list_tag *inList)

{
  IByteWriter *inLogStream;
  Log *pLVar1;
  size_t sVar2;
  string local_48;
  
  if (this->mShouldLog == true) {
    if (this->mLog == (Log *)0x0) {
      inLogStream = this->mLogStream;
      pLVar1 = (Log *)operator_new(0x60);
      if (inLogStream == (IByteWriter *)0x0) {
        Log::Log(pLVar1,&this->mLogFilePath,this->mPlaceUTF8Bom);
      }
      else {
        Log::Log(pLVar1,inLogStream);
      }
      this->mLog = pLVar1;
    }
    vsprintf(this->mBuffer,inFormat,inList);
    pLVar1 = this->mLog;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar2 = strlen(this->mBuffer);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,this,this->mBuffer + sVar2);
    Log::LogEntry(pLVar1,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Trace::TraceToLog(const char* inFormat,va_list inList)
{
	if(mShouldLog)
	{
		if(NULL == mLog)
		{
			if(mLogStream)
				mLog = new Log(mLogStream);
			else
				mLog = new Log(mLogFilePath,mPlaceUTF8Bom);
		}

		SAFE_VSPRINTF(mBuffer, MAX_TRACE_SIZE,inFormat,inList);

		mLog->LogEntry(std::string(mBuffer));
	}

}